

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CNewIdentifier *exp)

{
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
  *puVar2;
  pointer pCVar3;
  CError local_e0;
  TypeInfo local_b0;
  CError local_78;
  undefined1 local_48 [8];
  string errorMessage;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_true>
  local_20;
  CNewIdentifier *local_18;
  CNewIdentifier *exp_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = exp;
  exp_local = (CNewIdentifier *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: CNewIdentifier\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->identifier);
  if (bVar1) {
    puVar2 = &std::__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->table)->classes;
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                       (&local_18->identifier);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
         ::find(puVar2,&pCVar3->name);
    puVar2 = &std::__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->table)->classes;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
         ::end(puVar2);
    bVar1 = std::__detail::operator==(&local_20,&local_28);
    if (bVar1) {
      pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                         (&local_18->identifier);
      CError::GetUndeclaredErrorMessage((CError *)local_48,&pCVar3->name);
      CError::CError(&local_78,(string *)local_48,
                     &(local_18->super_IExpression).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_78);
      CError::~CError(&local_78);
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                         (&local_18->identifier);
      TypeInfo::TypeInfo(&local_b0,&pCVar3->name);
      TypeInfo::operator=(&this->lastCalculatedType,&local_b0);
      TypeInfo::~TypeInfo(&local_b0);
    }
  }
  else {
    CError::CError(&local_e0,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(local_18->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_e0);
    CError::~CError(&local_e0);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CNewIdentifier &exp ) 
{
    std::cout << "typechecker: CNewIdentifier\n";

    if( exp.identifier ) {
        if( table->classes.find(exp.identifier->name) == table->classes.end() ) {
            auto errorMessage = CError::GetUndeclaredErrorMessage( exp.identifier->name );
            errors.push_back( CError( errorMessage, exp.position) );
            return;
        }
        lastCalculatedType = exp.identifier->name;
    } else {
        errors.push_back( CError( CError::AST_ERROR, exp.position ) );
    }
}